

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LY_ERR lyd_dup_meta_single_to_ctx(ly_ctx *parent_ctx,lyd_meta *meta,lyd_node *parent,lyd_meta **dup)

{
  lyd_node *name;
  lyd_meta *ctx;
  lys_module *mod_00;
  size_t sVar1;
  lysc_ext_instance *plVar2;
  char *__s;
  lyd_value *val;
  ly_ctx *local_a0;
  ly_ctx *local_68;
  char *val_can;
  lys_module *mod;
  lysc_type *ant_type;
  lyd_meta *last;
  lyd_meta *mt;
  lyd_meta **pplStack_30;
  LY_ERR ret;
  lyd_meta **dup_local;
  lyd_node *parent_local;
  lyd_meta *meta_local;
  ly_ctx *parent_ctx_local;
  
  mt._4_4_ = 0;
  pplStack_30 = dup;
  dup_local = (lyd_meta **)parent;
  parent_local = (lyd_node *)meta;
  meta_local = (lyd_meta *)parent_ctx;
  if (meta == (lyd_meta *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","meta",
           "lyd_dup_meta_single_to_ctx");
    return LY_EINVAL;
  }
  if (parent == (lyd_node *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","parent",
           "lyd_dup_meta_single_to_ctx");
    return LY_EINVAL;
  }
  last = (lyd_meta *)calloc(1,0x48);
  if (last == (lyd_meta *)0x0) {
    if (dup_local[1] == (lyd_meta *)0x0) {
      local_68 = (ly_ctx *)dup_local[0xf];
    }
    else {
      local_68 = (ly_ctx *)dup_local[1]->next->parent;
    }
    ly_log(local_68,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_dup_meta_single_to_ctx"
          );
    return LY_EMEM;
  }
  if (meta_local == *(lyd_meta **)&((parent_local->parent->field_0).node.parent)->field_0) {
    last->annotation = (lysc_ext_instance *)parent_local->parent;
    mt._4_4_ = (*(code *)parent_local->meta->annotation->parent_stmt_index)
                         (meta_local,&parent_local->prev,&last->value);
  }
  else {
    mod_00 = ly_ctx_get_module((ly_ctx *)meta_local,
                               (char *)(((parent_local->parent->field_0).node.parent)->field_0).node
                                       .schema,
                               (char *)(((parent_local->parent->field_0).node.parent)->field_0).node
                                       .parent);
    name = parent_local->next;
    sVar1 = strlen((char *)parent_local->next);
    plVar2 = lyd_get_meta_annotation(mod_00,(char *)name,sVar1);
    last->annotation = plVar2;
    lyplg_ext_get_storage(last->annotation,0x2e0000,8,&mod);
    mt._4_4_ = LY_EINVAL;
    if (last->annotation != (lysc_ext_instance *)0x0) {
      mt._4_4_ = LY_SUCCESS;
    }
    if (mt._4_4_ != LY_SUCCESS) {
      ly_log((ly_ctx *)meta_local,LY_LLERR,LY_EINVAL,
             "Annotation for metadata %s not found, value duplication failed.",parent_local->next);
      goto LAB_0012f51c;
    }
    __s = lyd_value_get_canonical
                    (*(ly_ctx **)&((parent_local->parent->field_0).node.parent)->field_0,
                     (lyd_value *)&parent_local->prev);
    ctx = meta_local;
    val = &last->value;
    sVar1 = strlen(__s);
    mt._4_4_ = lyd_value_store((ly_ctx *)ctx,val,(lysc_type *)mod,__s,sVar1,'\x01','\x01',
                               (ly_bool *)0x0,LY_VALUE_CANON,(void *)0x0,0x3f3,
                               (lysc_node *)dup_local[1],(ly_bool *)0x0);
  }
  if (mt._4_4_ == LY_SUCCESS) {
    mt._4_4_ = lydict_insert((ly_ctx *)meta_local,(char *)parent_local->next,0,&last->name);
    if (mt._4_4_ == LY_SUCCESS) {
      last->parent = (lyd_node *)dup_local;
      if (dup_local[5] == (lyd_meta *)0x0) {
        dup_local[5] = last;
      }
      else {
        for (ant_type = (lysc_type *)dup_local[5]; ant_type->exts != (lysc_ext_instance *)0x0;
            ant_type = (lysc_type *)ant_type->exts) {
        }
        ant_type->exts = (lysc_ext_instance *)last;
      }
    }
  }
  else {
    if (dup_local[1] == (lyd_meta *)0x0) {
      local_a0 = (ly_ctx *)dup_local[0xf];
    }
    else {
      local_a0 = (ly_ctx *)dup_local[1]->next->parent;
    }
    ly_log(local_a0,LY_LLERR,LY_EINT,"Value duplication failed.");
  }
LAB_0012f51c:
  if (mt._4_4_ == LY_SUCCESS) {
    if (pplStack_30 != (lyd_meta **)0x0) {
      *pplStack_30 = last;
    }
  }
  else {
    lyd_free_meta_single(last);
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lyd_dup_meta_single_to_ctx(const struct ly_ctx *parent_ctx, const struct lyd_meta *meta, struct lyd_node *parent,
        struct lyd_meta **dup)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyd_meta *mt, *last;
    const struct lysc_type *ant_type;
    struct lys_module *mod;
    const char *val_can;

    LY_CHECK_ARG_RET(NULL, meta, parent, LY_EINVAL);

    /* create a copy */
    mt = calloc(1, sizeof *mt);
    LY_CHECK_ERR_RET(!mt, LOGMEM(LYD_CTX(parent)), LY_EMEM);

    if (parent_ctx != meta->annotation->module->ctx) {
        /* different contexts */
        mod = ly_ctx_get_module(parent_ctx, meta->annotation->module->name, meta->annotation->module->revision);

        /* annotation */
        mt->annotation = lyd_get_meta_annotation(mod, meta->name, strlen(meta->name));
        lyplg_ext_get_storage(mt->annotation, LY_STMT_TYPE, sizeof ant_type, (const void **)&ant_type);
        LY_CHECK_ERR_GOTO((ret = mt->annotation ? LY_SUCCESS : LY_EINVAL), LOGERR(parent_ctx, LY_EINVAL,
                "Annotation for metadata %s not found, value duplication failed.", meta->name), finish);

        /* duplicate callback expect only the same contexts, so use the store callback */
        val_can = lyd_value_get_canonical(meta->annotation->module->ctx, &meta->value);
        ret = lyd_value_store(parent_ctx, &mt->value, ant_type, val_can, strlen(val_can), 1, 1, NULL,
                LY_VALUE_CANON, NULL, LYD_HINT_DATA, parent->schema, NULL);
    } else {
        /* annotation */
        mt->annotation = meta->annotation;
        /* duplication of value */
        ret = meta->value.realtype->plugin->duplicate(parent_ctx, &meta->value, &mt->value);
    }
    LY_CHECK_ERR_GOTO(ret, LOGERR(LYD_CTX(parent), LY_EINT, "Value duplication failed."), finish);
    LY_CHECK_GOTO(ret = lydict_insert(parent_ctx, meta->name, 0, &mt->name), finish);

    /* insert as the last attribute */
    mt->parent = parent;
    if (parent->meta) {
        for (last = parent->meta; last->next; last = last->next) {}
        last->next = mt;
    } else {
        parent->meta = mt;
    }

finish:
    if (ret) {
        lyd_free_meta_single(mt);
    } else if (dup) {
        *dup = mt;
    }
    return LY_SUCCESS;
}